

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_Value.h
# Opt level: O3

bool soul::isMIDIMessageStruct(Type *type)

{
  Object *pOVar1;
  ulong uVar2;
  char *pcVar3;
  MemberNameAndType *pMVar4;
  long *plVar5;
  size_type len1;
  
  if (type->mainType == object) {
    pOVar1 = (type->content).object;
    uVar2 = (pOVar1->className)._M_len;
    if ((((6 < uVar2) &&
         (pcVar3 = (pOVar1->className)._M_str,
         *(int *)(pcVar3 + (uVar2 - 4)) == 0x65676173 &&
         *(int *)(pcVar3 + (uVar2 - 7)) == 0x7373654d)) && ((pOVar1->members).size == 1)) &&
       ((pMVar4 = (pOVar1->members).items, (pMVar4->name)._M_len == 9 &&
        (plVar5 = (long *)(pMVar4->name)._M_str,
        (char)plVar5[1] == 's' && *plVar5 == 0x657479426964696d)))) {
      return (pMVar4->type).mainType == int32;
    }
  }
  return false;
}

Assistant:

bool isType (Types... types) const noexcept   { return ((mainType == types) || ...); }